

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
          (mapping<std::_List_iterator<wchar_t>_> *this,boundary_type type,base_iterator begin,
          base_iterator end,locale *loc)

{
  element_type *peVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *__p;
  index_type local_48;
  
  __p = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
         *)operator_new(0x18);
  (__p->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index_).
  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>*>
            (&(this->index_).
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (this->begin_)._M_node = begin._M_node;
  (this->end_)._M_node = end._M_node;
  mapping_traits<std::_List_iterator<wchar_t>,_std::bidirectional_iterator_tag>::map
            (&local_48,type,(_List_iterator<wchar_t>)begin._M_node,
             (_List_iterator<wchar_t>)end._M_node,loc);
  peVar1 = (this->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pbVar2 = (peVar1->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (peVar1->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (peVar1->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (peVar1->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (peVar1->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (peVar1->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (pbVar2 != (pointer)0x0) {
    local_48.
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar2;
    local_48.
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    local_48.
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar4;
    operator_delete(pbVar2);
  }
  return;
}

Assistant:

mapping(boundary_type type,
                            base_iterator begin,
                            base_iterator end,
                            std::locale const &loc) 
                        :   
                            index_(new index_type()),
                            begin_(begin),
                            end_(end)
                    {
                        index_type idx=details::mapping_traits<base_iterator>::map(type,begin,end,loc);
                        index_->swap(idx);
                    }